

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result cb_end_addr(rfc5444_reader_tlvblock_context *ctx,_Bool dropped)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint8_t ai;
  uint8_t *addr;
  int oi;
  _Bool dropped_local;
  rfc5444_reader_tlvblock_context *ctx_local;
  
  iVar3 = ctx->consumer->order + -1;
  bVar2 = (ctx->addr)._addr[3] - 1;
  printf("%s: address %d end (order %d): %d\n","cb_end_addr",(ulong)(bVar2 + 1),
         (ulong)(uint)ctx->consumer->order,(ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_end_address[iVar3][bVar2] = callback_index;
  callback_index = iVar1;
  return result_end_address[iVar3][bVar2];
}

Assistant:

static enum rfc5444_result
cb_end_addr(struct rfc5444_reader_tlvblock_context *ctx,
    bool dropped __attribute__ ((unused))) {
  int oi = ctx->consumer->order - 1;
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;

#ifdef PRINT_CB
  printf("%s: address %d end (order %d): %d\n", __func__, ai+1, ctx->consumer->order, callback_index);
#endif
  idxcb_end_address[oi][ai] = callback_index++;
  return result_end_address[oi][ai];
}